

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorPool::Tables::FindAllExtensions
          (Tables *this,Descriptor *extendee,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *out)

{
  bool bVar1;
  pointer ppVar2;
  _Rb_tree_const_iterator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>
  *in_RDX;
  Descriptor *in_RSI;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *in_RDI;
  pair<const_google::protobuf::Descriptor_*,_int> pVar3;
  const_iterator it;
  map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
  *in_stack_ffffffffffffff88;
  Descriptor **in_stack_ffffffffffffff90;
  _Rb_tree_const_iterator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>
  *this_00;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar4;
  _Self local_50;
  Descriptor *local_48;
  int local_40;
  undefined4 local_34;
  Descriptor *local_30;
  int local_28;
  _Self local_20;
  _Rb_tree_const_iterator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>
  *local_18;
  Descriptor *local_10;
  
  local_34 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pVar3 = std::make_pair<google::protobuf::Descriptor_const*&,int>
                    (in_stack_ffffffffffffff90,(int *)in_stack_ffffffffffffff88);
  local_48 = pVar3.first;
  local_40 = pVar3.second;
  local_30 = local_48;
  local_28 = local_40;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
       ::lower_bound(in_stack_ffffffffffffff88,(key_type *)0x4d6fe9);
  while( true ) {
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
         ::end(in_stack_ffffffffffffff88);
    bVar1 = std::operator!=(&local_20,&local_50);
    uVar4 = false;
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>
                             *)0x4d702c);
      uVar4 = (ppVar2->first).first == local_10;
    }
    if ((bool)uVar4 == false) break;
    this_00 = local_18;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>
                  *)0x4d7059);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back(in_RDI,(value_type *)CONCAT17(uVar4,in_stack_ffffffffffffff98));
    std::
    _Rb_tree_const_iterator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>
    ::operator++(this_00);
  }
  return;
}

Assistant:

inline void DescriptorPool::Tables::FindAllExtensions(
    const Descriptor* extendee,
    std::vector<const FieldDescriptor*>* out) const {
  ExtensionsGroupedByDescriptorMap::const_iterator it =
      extensions_.lower_bound(std::make_pair(extendee, 0));
  for (; it != extensions_.end() && it->first.first == extendee; ++it) {
    out->push_back(it->second);
  }
}